

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

pair<sjtu::TrainManager::stationNameType_*,_long> __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::newspace
          (FileManager<sjtu::TrainManager::stationNameType> *this)

{
  long in_RDI;
  stationNameType **__x;
  pair<sjtu::TrainManager::stationNameType_*,_long> pVar1;
  locType *in_stack_00000008;
  LRUCache<sjtu::TrainManager::stationNameType> *in_stack_00000010;
  locType offset;
  stationNameType tmp;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar2;
  fpos local_60 [16];
  streamoff local_50;
  undefined1 local_41 [65];
  
  __x = (stationNameType **)(in_RDI + 0x18);
  uVar2 = 0;
  std::ostream::seekp((long)__x,_S_beg);
  std::ios::clear(in_RDI + 8 + *(long *)(*(long *)(in_RDI + 8) + -0x18),uVar2);
  local_60 = (fpos  [16])std::ostream::tellp();
  local_50 = std::fpos::operator_cast_to_long(local_60);
  std::ostream::write((char *)__x,(long)local_41);
  LRUCache<sjtu::TrainManager::stationNameType>::load(in_stack_00000010,in_stack_00000008);
  pVar1 = std::make_pair<sjtu::TrainManager::stationNameType*,long&>
                    (__x,(long *)CONCAT44(uVar2,in_stack_ffffffffffffff78));
  return pVar1;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			file.seekp(0 , std::ios_base::end) , file.clear();
			T tmp;locType offset = file.tellp();
			file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
			return std::make_pair(cache -> load(offset) , offset);
		}